

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRgba.cpp
# Opt level: O0

void anon_unknown.dwarf_1c4133::rgbaMethods(void)

{
  bool bVar1;
  float fVar2;
  Rgba w;
  Rgba z;
  Rgba y;
  Rgba x;
  Rgba local_30;
  half local_28;
  half hStackY_26;
  float f;
  half in_stack_ffffffffffffffe0;
  half in_stack_ffffffffffffffe2;
  half in_stack_ffffffffffffffe4;
  half in_stack_ffffffffffffffe6;
  Rgba local_18;
  half local_10;
  half local_e;
  half local_c;
  half local_a;
  Rgba local_8;
  
  half::half((half *)CONCAT26(in_stack_ffffffffffffffe6._h,
                              CONCAT24(in_stack_ffffffffffffffe4._h,
                                       CONCAT22(in_stack_ffffffffffffffe2._h,
                                                in_stack_ffffffffffffffe0._h))),f);
  half::half((half *)CONCAT26(in_stack_ffffffffffffffe6._h,
                              CONCAT24(in_stack_ffffffffffffffe4._h,
                                       CONCAT22(in_stack_ffffffffffffffe2._h,
                                                in_stack_ffffffffffffffe0._h))),f);
  half::half((half *)CONCAT26(in_stack_ffffffffffffffe6._h,
                              CONCAT24(in_stack_ffffffffffffffe4._h,
                                       CONCAT22(in_stack_ffffffffffffffe2._h,
                                                in_stack_ffffffffffffffe0._h))),f);
  half::half((half *)CONCAT26(in_stack_ffffffffffffffe6._h,
                              CONCAT24(in_stack_ffffffffffffffe4._h,
                                       CONCAT22(in_stack_ffffffffffffffe2._h,
                                                in_stack_ffffffffffffffe0._h))),f);
  Imf_2_5::Rgba::Rgba(&local_8,local_a,local_c,local_e,local_10);
  fVar2 = half::operator_cast_to_float(&local_8.r);
  bVar1 = false;
  if ((fVar2 == 2.0) && (!NAN(fVar2))) {
    fVar2 = half::operator_cast_to_float(&local_8.g);
    bVar1 = false;
    if ((fVar2 == 3.0) && (!NAN(fVar2))) {
      fVar2 = half::operator_cast_to_float(&local_8.b);
      bVar1 = false;
      if ((fVar2 == 4.0) && (!NAN(fVar2))) {
        fVar2 = half::operator_cast_to_float(&local_8.a);
        bVar1 = fVar2 == 1.0;
      }
    }
  }
  if (!bVar1) {
    __assert_fail("x.r == 2.f && x.g == 3.f && x.b == 4.f && x.a == 1.f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                  ,0x47,"void (anonymous namespace)::rgbaMethods()");
  }
  half::half((half *)CONCAT26(in_stack_ffffffffffffffe6._h,
                              CONCAT24(in_stack_ffffffffffffffe4._h,
                                       CONCAT22(in_stack_ffffffffffffffe2._h,
                                                in_stack_ffffffffffffffe0._h))),f);
  half::half((half *)CONCAT26(in_stack_ffffffffffffffe6._h,
                              CONCAT24(in_stack_ffffffffffffffe4._h,
                                       CONCAT22(in_stack_ffffffffffffffe2._h,
                                                in_stack_ffffffffffffffe0._h))),f);
  half::half((half *)CONCAT26(in_stack_ffffffffffffffe6._h,
                              CONCAT24(in_stack_ffffffffffffffe4._h,
                                       CONCAT22(in_stack_ffffffffffffffe2._h,
                                                in_stack_ffffffffffffffe0._h))),f);
  half::half((half *)CONCAT26(in_stack_ffffffffffffffe6._h,
                              CONCAT24(in_stack_ffffffffffffffe4._h,
                                       CONCAT22(in_stack_ffffffffffffffe2._h,
                                                in_stack_ffffffffffffffe0._h))),f);
  Imf_2_5::Rgba::Rgba(&local_18,in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe4,
                      in_stack_ffffffffffffffe2,in_stack_ffffffffffffffe0);
  fVar2 = half::operator_cast_to_float(&local_18.r);
  bVar1 = false;
  if ((fVar2 == 5.0) && (!NAN(fVar2))) {
    fVar2 = half::operator_cast_to_float(&local_18.g);
    bVar1 = false;
    if ((fVar2 == 6.0) && (!NAN(fVar2))) {
      fVar2 = half::operator_cast_to_float(&local_18.b);
      bVar1 = false;
      if ((fVar2 == 7.0) && (!NAN(fVar2))) {
        fVar2 = half::operator_cast_to_float(&local_18.a);
        bVar1 = fVar2 == 0.0;
      }
    }
  }
  if (!bVar1) {
    __assert_fail("y.r == 5.f && y.g == 6.f && y.b == 7.f && y.a == 0.f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                  ,0x4a,"void (anonymous namespace)::rgbaMethods()");
  }
  Imf_2_5::Rgba::Rgba((Rgba *)&local_28);
  _local_28 = local_8;
  fVar2 = half::operator_cast_to_float(&local_28);
  bVar1 = false;
  if ((fVar2 == 2.0) && (!NAN(fVar2))) {
    fVar2 = half::operator_cast_to_float(&hStackY_26);
    bVar1 = false;
    if ((fVar2 == 3.0) && (!NAN(fVar2))) {
      fVar2 = half::operator_cast_to_float((half *)&stack0xffffffffffffffdc);
      bVar1 = false;
      if ((fVar2 == 4.0) && (!NAN(fVar2))) {
        fVar2 = half::operator_cast_to_float((half *)&stack0xffffffffffffffde);
        bVar1 = fVar2 == 1.0;
      }
    }
  }
  if (!bVar1) {
    __assert_fail("z.r == 2.f && z.g == 3.f && z.b == 4.f && z.a == 1.f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                  ,0x4f,"void (anonymous namespace)::rgbaMethods()");
  }
  _local_28 = local_18;
  fVar2 = half::operator_cast_to_float(&local_28);
  bVar1 = false;
  if ((fVar2 == 5.0) && (!NAN(fVar2))) {
    fVar2 = half::operator_cast_to_float(&hStackY_26);
    bVar1 = false;
    if ((fVar2 == 6.0) && (!NAN(fVar2))) {
      fVar2 = half::operator_cast_to_float((half *)&stack0xffffffffffffffdc);
      bVar1 = false;
      if ((fVar2 == 7.0) && (!NAN(fVar2))) {
        fVar2 = half::operator_cast_to_float((half *)&stack0xffffffffffffffde);
        bVar1 = fVar2 == 0.0;
      }
    }
  }
  if (!bVar1) {
    __assert_fail("z.r == 5.f && z.g == 6.f && z.b == 7.f && z.a == 0.f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                  ,0x52,"void (anonymous namespace)::rgbaMethods()");
  }
  local_30 = _local_28;
  fVar2 = half::operator_cast_to_float(&local_30.r);
  bVar1 = false;
  if ((fVar2 == 5.0) && (!NAN(fVar2))) {
    fVar2 = half::operator_cast_to_float(&local_30.g);
    bVar1 = false;
    if ((fVar2 == 6.0) && (!NAN(fVar2))) {
      fVar2 = half::operator_cast_to_float(&local_30.b);
      bVar1 = false;
      if ((fVar2 == 7.0) && (!NAN(fVar2))) {
        fVar2 = half::operator_cast_to_float(&local_30.a);
        bVar1 = fVar2 == 0.0;
      }
    }
  }
  if (!bVar1) {
    __assert_fail("w.r == 5.f && w.g == 6.f && w.b == 7.f && w.a == 0.f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                  ,0x55,"void (anonymous namespace)::rgbaMethods()");
  }
  return;
}

Assistant:

void
rgbaMethods ()
{
    //
    // Verify that the constructors and the assignment
    // operator for struct Rgba work.
    //

    Rgba x (2.f, 3.f, 4.f);
    assert (x.r == 2.f && x.g == 3.f && x.b == 4.f && x.a == 1.f);

    Rgba y (5.f, 6.f, 7.f, 0.f);
    assert (y.r == 5.f && y.g == 6.f && y.b == 7.f && y.a == 0.f);

    Rgba z;

    z = x;
    assert (z.r == 2.f && z.g == 3.f && z.b == 4.f && z.a == 1.f);

    z = y;
    assert (z.r == 5.f && z.g == 6.f && z.b == 7.f && z.a == 0.f);

    Rgba w (z);
    assert (w.r == 5.f && w.g == 6.f && w.b == 7.f && w.a == 0.f);
}